

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osnetunix.h
# Opt level: O3

void __thiscall OS_Thread::sys_thread_cleanup(OS_Thread *this,void *ctx)

{
  OS_Counter *pOVar1;
  OS_Event *this_00;
  __sighandler_t __handler;
  int __sig;
  
  __sig = (int)ctx;
  this_00 = this->done_evt;
  LOCK();
  pOVar1 = &(this_00->super_CVmRefCntObj).cnt;
  (pOVar1->cnt).super___atomic_base<long>._M_i = (pOVar1->cnt).super___atomic_base<long>._M_i + 1;
  UNLOCK();
  CVmWeakRefable::release_ref(&this->super_CVmWeakRefable);
  OS_Event::signal(this_00,__sig,__handler);
  LOCK();
  pOVar1 = &(this_00->super_CVmRefCntObj).cnt;
  (pOVar1->cnt).super___atomic_base<long>._M_i = (pOVar1->cnt).super___atomic_base<long>._M_i + -1;
  UNLOCK();
  if ((pOVar1->cnt).super___atomic_base<long>._M_i == 0) {
    (*(this_00->super_CVmRefCntObj)._vptr_CVmRefCntObj[1])(this_00);
    return;
  }
  return;
}

Assistant:

static void sys_thread_cleanup(void *ctx)
    {
        /* the context is the thread structure */
        OS_Thread *t = (OS_Thread *)ctx;

        /* before we release our ref on the thread, save its done event */
        OS_Event *done_evt = t->done_evt;
        done_evt->add_ref();

        /* release the thread's reference on the thread structure */
        t->release_ref();

        /* the thread has now truly exited - signal the termination event */
        done_evt->signal();
        done_evt->release_ref();
    }